

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::ensure_correct_input_type
          (CompilerMSL *this,uint32_t type_id,uint32_t location,uint32_t component,
          uint32_t num_components,bool strip_array)

{
  MSLShaderVariableFormat MVar1;
  BaseType BVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRType *pSVar5;
  size_t sVar6;
  pointer ppVar7;
  CompilerError *pCVar8;
  uint32_t local_a4;
  uint32_t local_90;
  uint32_t local_88;
  _Self local_58;
  key_type local_50;
  _Self local_48;
  iterator p_va;
  uint32_t max_array_dimensions;
  SPIRType *type;
  uint local_28;
  bool strip_array_local;
  uint32_t num_components_local;
  uint32_t component_local;
  uint32_t location_local;
  uint32_t type_id_local;
  CompilerMSL *this_local;
  
  pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
  p_va._M_node._4_4_ = (uint)strip_array;
  this_local._4_4_ = type_id;
  if ((pSVar5->basetype != Struct) &&
     (sVar6 = VectorView<unsigned_int>::size(&(pSVar5->array).super_VectorView<unsigned_int>),
     sVar6 <= p_va._M_node._4_4_)) {
    local_50.location = location;
    local_50.component = component;
    local_48._M_node =
         (_Base_ptr)
         ::std::
         map<spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable,_std::less<spirv_cross::LocationComponentPair>,_std::allocator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>_>
         ::find(&this->inputs_by_location,&local_50);
    local_58._M_node =
         (_Base_ptr)
         ::std::
         end<std::map<spirv_cross::LocationComponentPair,spirv_cross::MSLShaderInterfaceVariable,std::less<spirv_cross::LocationComponentPair>,std::allocator<std::pair<spirv_cross::LocationComponentPair_const,spirv_cross::MSLShaderInterfaceVariable>>>>
                   (&this->inputs_by_location);
    bVar3 = ::std::operator==(&local_48,&local_58);
    if (bVar3) {
      if (pSVar5->vecsize < num_components) {
        this_local._4_4_ = build_extended_vector_type(this,type_id,num_components,Unknown);
      }
    }
    else {
      local_28 = num_components;
      if (num_components == 0) {
        ppVar7 = ::std::
                 _Rb_tree_iterator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>
                 ::operator->(&local_48);
        local_28 = (ppVar7->second).vecsize;
      }
      ppVar7 = ::std::
               _Rb_tree_iterator<std::pair<const_spirv_cross::LocationComponentPair,_spirv_cross::MSLShaderInterfaceVariable>_>
               ::operator->(&local_48);
      MVar1 = (ppVar7->second).format;
      if (MVar1 == MSL_SHADER_INPUT_FORMAT_UINT8) {
        switch(pSVar5->basetype) {
        case UByte:
        case UShort:
        case UInt:
          if (pSVar5->vecsize < local_28) {
            this_local._4_4_ = build_extended_vector_type(this,type_id,local_28,Unknown);
          }
          break;
        case Short:
          if (pSVar5->vecsize < local_28) {
            local_88 = local_28;
          }
          else {
            local_88 = pSVar5->vecsize;
          }
          this_local._4_4_ = build_extended_vector_type(this,type_id,local_88,UShort);
          break;
        case Int:
          if (pSVar5->vecsize < local_28) {
            local_90 = local_28;
          }
          else {
            local_90 = pSVar5->vecsize;
          }
          this_local._4_4_ = build_extended_vector_type(this,type_id,local_90,UInt);
          break;
        default:
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar8,"Vertex attribute type mismatch between host and shader");
          __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
      else if (MVar1 == MSL_SHADER_INPUT_FORMAT_UINT16) {
        BVar2 = pSVar5->basetype;
        if (BVar2 != UShort) {
          if (BVar2 == Int) {
            if (pSVar5->vecsize < local_28) {
              local_a4 = local_28;
            }
            else {
              local_a4 = pSVar5->vecsize;
            }
            uVar4 = build_extended_vector_type(this,type_id,local_a4,UInt);
            return uVar4;
          }
          if (BVar2 != UInt) {
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar8,"Vertex attribute type mismatch between host and shader");
            __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
        }
        if (pSVar5->vecsize < local_28) {
          this_local._4_4_ = build_extended_vector_type(this,type_id,local_28,Unknown);
        }
      }
      else {
        component_local = type_id;
        if (pSVar5->vecsize < local_28) {
          component_local = build_extended_vector_type(this,type_id,local_28,Unknown);
        }
        this_local._4_4_ = component_local;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::ensure_correct_input_type(uint32_t type_id, uint32_t location, uint32_t component, uint32_t num_components, bool strip_array)
{
	auto &type = get<SPIRType>(type_id);

	uint32_t max_array_dimensions = strip_array ? 1 : 0;

	// Struct and array types must match exactly.
	if (type.basetype == SPIRType::Struct || type.array.size() > max_array_dimensions)
		return type_id;

	auto p_va = inputs_by_location.find({location, component});
	if (p_va == end(inputs_by_location))
	{
		if (num_components > type.vecsize)
			return build_extended_vector_type(type_id, num_components);
		else
			return type_id;
	}

	if (num_components == 0)
		num_components = p_va->second.vecsize;

	switch (p_va->second.format)
	{
	case MSL_SHADER_VARIABLE_FORMAT_UINT8:
	{
		switch (type.basetype)
		{
		case SPIRType::UByte:
		case SPIRType::UShort:
		case SPIRType::UInt:
			if (num_components > type.vecsize)
				return build_extended_vector_type(type_id, num_components);
			else
				return type_id;

		case SPIRType::Short:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UShort);
		case SPIRType::Int:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UInt);

		default:
			SPIRV_CROSS_THROW("Vertex attribute type mismatch between host and shader");
		}
	}

	case MSL_SHADER_VARIABLE_FORMAT_UINT16:
	{
		switch (type.basetype)
		{
		case SPIRType::UShort:
		case SPIRType::UInt:
			if (num_components > type.vecsize)
				return build_extended_vector_type(type_id, num_components);
			else
				return type_id;

		case SPIRType::Int:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UInt);

		default:
			SPIRV_CROSS_THROW("Vertex attribute type mismatch between host and shader");
		}
	}

	default:
		if (num_components > type.vecsize)
			type_id = build_extended_vector_type(type_id, num_components);
		break;
	}

	return type_id;
}